

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS ref_grid_orient_edg(REF_GRID ref_grid,REF_INT *nodes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  REF_INT RVar10;
  char *pcVar11;
  int iVar12;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 uVar13;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT edg_qua;
  REF_INT edg_tri;
  REF_INT qua_nodes [27];
  REF_INT tri_nodes [27];
  
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  uVar5 = ref_cell_list_with2(ref_grid->cell[3],*nodes,nodes[1],1,&ntri,&edg_tri);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x472,
           "ref_grid_orient_edg",(ulong)uVar5,"tri with edge side");
    return uVar5;
  }
  uVar5 = 1;
  uVar6 = ref_cell_list_with2(ref_grid->cell[6],*nodes,nodes[1],1,&nqua,&edg_qua);
  if (uVar6 == 0) {
    iVar7 = nqua + ntri;
    if (iVar7 == 1) {
      iVar7 = nqua;
      if (ntri < nqua) {
        iVar7 = ntri;
      }
      if (iVar7 == 0) {
        if (ntri == 1) {
          uVar6 = ref_cell_nodes(ref_grid->cell[3],edg_tri,tri_nodes);
          if (uVar6 != 0) {
            pcVar11 = "tri nodes";
            uVar8 = 0x47c;
            goto LAB_00151ecf;
          }
          iVar1 = *nodes;
          iVar2 = nodes[1];
          iVar3 = iVar2;
          if (iVar1 < iVar2) {
            iVar3 = iVar1;
          }
          RVar10 = tri_nodes[1];
          if (tri_nodes[0] < tri_nodes[1]) {
            RVar10 = tri_nodes[0];
          }
          if (iVar3 == RVar10) {
            iVar4 = iVar2;
            if (iVar2 < iVar1) {
              iVar4 = iVar1;
            }
            RVar10 = tri_nodes[1];
            if (tri_nodes[1] < tri_nodes[0]) {
              RVar10 = tri_nodes[0];
            }
            iVar7 = -1;
            iVar12 = -1;
            if (iVar4 == RVar10) {
              iVar7 = tri_nodes[0];
              iVar12 = tri_nodes[1];
            }
          }
          else {
            iVar7 = -1;
            iVar12 = -1;
          }
          RVar10 = tri_nodes[2];
          if (tri_nodes[1] < tri_nodes[2]) {
            RVar10 = tri_nodes[1];
          }
          if (iVar3 == RVar10) {
            iVar4 = iVar2;
            if (iVar2 < iVar1) {
              iVar4 = iVar1;
            }
            RVar10 = tri_nodes[2];
            if (tri_nodes[2] < tri_nodes[1]) {
              RVar10 = tri_nodes[1];
            }
            if (iVar4 == RVar10) {
              iVar7 = tri_nodes[1];
              iVar12 = tri_nodes[2];
            }
          }
          RVar10 = tri_nodes[0];
          if (tri_nodes[2] < tri_nodes[0]) {
            RVar10 = tri_nodes[2];
          }
          if (iVar3 == RVar10) {
            if (iVar2 < iVar1) {
              iVar2 = iVar1;
            }
            RVar10 = tri_nodes[0];
            if (tri_nodes[0] < tri_nodes[2]) {
              RVar10 = tri_nodes[2];
            }
            if (iVar2 == RVar10) {
              iVar7 = tri_nodes[2];
              iVar12 = tri_nodes[0];
            }
          }
        }
        else {
          iVar7 = -1;
          iVar12 = -1;
        }
        if (nqua != 1) {
LAB_0015211f:
          if (iVar7 == -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x4ab,"ref_grid_orient_edg","node0 not found");
            uVar8 = CONCAT44(uVar13,0xffffffff);
            printf("nodes %d %d %d ntri %d nqua %d node0 %d node1 %d\n",(ulong)(uint)*nodes,
                   (ulong)(uint)nodes[1],(ulong)(uint)nodes[2],(ulong)(uint)ntri,(ulong)(uint)nqua,
                   uVar8,iVar12);
            if (nqua < 1) {
              return 1;
            }
            printf("qua %d %d %d %d %d\n",(ulong)(uint)qua_nodes[0],(ulong)(uint)qua_nodes[1],
                   (ulong)(uint)qua_nodes[2],(ulong)(uint)qua_nodes[3],(ulong)(uint)qua_nodes[4],
                   uVar8,iVar12);
            return 1;
          }
          if (iVar12 != -1) {
            *nodes = iVar7;
            nodes[1] = iVar12;
            return 0;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x4ac,"ref_grid_orient_edg","node1 not found");
          return 1;
        }
        uVar6 = ref_cell_nodes(ref_grid->cell[6],edg_qua,qua_nodes);
        if (uVar6 == 0) {
          iVar1 = *nodes;
          iVar2 = nodes[1];
          iVar3 = iVar2;
          if (iVar1 < iVar2) {
            iVar3 = iVar1;
          }
          RVar10 = qua_nodes[1];
          if (qua_nodes[0] < qua_nodes[1]) {
            RVar10 = qua_nodes[0];
          }
          if (iVar3 == RVar10) {
            iVar4 = iVar2;
            if (iVar2 < iVar1) {
              iVar4 = iVar1;
            }
            RVar10 = qua_nodes[1];
            if (qua_nodes[1] < qua_nodes[0]) {
              RVar10 = qua_nodes[0];
            }
            if (iVar4 == RVar10) {
              iVar7 = qua_nodes[0];
              iVar12 = qua_nodes[1];
            }
          }
          RVar10 = qua_nodes[2];
          if (qua_nodes[1] < qua_nodes[2]) {
            RVar10 = qua_nodes[1];
          }
          if (iVar3 == RVar10) {
            iVar4 = iVar2;
            if (iVar2 < iVar1) {
              iVar4 = iVar1;
            }
            RVar10 = qua_nodes[2];
            if (qua_nodes[2] < qua_nodes[1]) {
              RVar10 = qua_nodes[1];
            }
            if (iVar4 == RVar10) {
              iVar7 = qua_nodes[1];
              iVar12 = qua_nodes[2];
            }
          }
          RVar10 = qua_nodes[3];
          if (qua_nodes[2] < qua_nodes[3]) {
            RVar10 = qua_nodes[2];
          }
          if (iVar3 == RVar10) {
            iVar4 = iVar2;
            if (iVar2 < iVar1) {
              iVar4 = iVar1;
            }
            RVar10 = qua_nodes[3];
            if (qua_nodes[3] < qua_nodes[2]) {
              RVar10 = qua_nodes[2];
            }
            if (iVar4 == RVar10) {
              iVar7 = qua_nodes[2];
              iVar12 = qua_nodes[3];
            }
          }
          RVar10 = qua_nodes[0];
          if (qua_nodes[3] < qua_nodes[0]) {
            RVar10 = qua_nodes[3];
          }
          if (iVar3 == RVar10) {
            if (iVar2 < iVar1) {
              iVar2 = iVar1;
            }
            RVar10 = qua_nodes[0];
            if (qua_nodes[0] < qua_nodes[3]) {
              RVar10 = qua_nodes[3];
            }
            if (iVar2 == RVar10) {
              iVar7 = qua_nodes[3];
              iVar12 = qua_nodes[0];
            }
          }
          goto LAB_0015211f;
        }
        pcVar11 = "qua nodes";
        uVar8 = 0x48f;
        goto LAB_00151ecf;
      }
      pcVar11 = "expect zero min tri/qua for an edge";
      uVar9 = 0x477;
      uVar8 = 0;
    }
    else {
      pcVar11 = "expect one tri/qua for an edge";
      uVar8 = 1;
      uVar9 = 0x476;
    }
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar9,
           "ref_grid_orient_edg",pcVar11,uVar8,(long)iVar7);
  }
  else {
    pcVar11 = "qua with edge side";
    uVar8 = 0x475;
LAB_00151ecf:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar8,
           "ref_grid_orient_edg",(ulong)uVar6,pcVar11);
    uVar5 = uVar6;
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_grid_orient_edg(REF_GRID ref_grid, REF_INT *nodes) {
  REF_INT ntri, edg_tri, nqua, edg_qua;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node0, node1;
  RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), nodes[0], nodes[1], 1, &ntri,
                          &edg_tri),
      "tri with edge side");
  RSS(ref_cell_list_with2(ref_grid_qua(ref_grid), nodes[0], nodes[1], 1, &nqua,
                          &edg_qua),
      "qua with edge side");
  REIS(1, ntri + nqua, "expect one tri/qua for an edge");
  REIS(0, MIN(ntri, nqua), "expect zero min tri/qua for an edge");
  node0 = REF_EMPTY;
  node1 = REF_EMPTY;
  if (1 == ntri) {
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), edg_tri, tri_nodes),
        "tri nodes");
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[0], tri_nodes[1])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[0], tri_nodes[1]))) {
      node0 = tri_nodes[0];
      node1 = tri_nodes[1];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[1], tri_nodes[2])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[1], tri_nodes[2]))) {
      node0 = tri_nodes[1];
      node1 = tri_nodes[2];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[2], tri_nodes[0])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[2], tri_nodes[0]))) {
      node0 = tri_nodes[2];
      node1 = tri_nodes[0];
    }
  }
  if (1 == nqua) {
    RSS(ref_cell_nodes(ref_grid_qua(ref_grid), edg_qua, qua_nodes),
        "qua nodes");
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[0], qua_nodes[1])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[0], qua_nodes[1]))) {
      node0 = qua_nodes[0];
      node1 = qua_nodes[1];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[1], qua_nodes[2])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[1], qua_nodes[2]))) {
      node0 = qua_nodes[1];
      node1 = qua_nodes[2];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[2], qua_nodes[3])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[2], qua_nodes[3]))) {
      node0 = qua_nodes[2];
      node1 = qua_nodes[3];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[3], qua_nodes[0])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[3], qua_nodes[0]))) {
      node0 = qua_nodes[3];
      node1 = qua_nodes[0];
    }
  }
  RUB(REF_EMPTY, node0, "node0 not found", {
    printf("nodes %d %d %d ntri %d nqua %d node0 %d node1 %d\n", nodes[0],
           nodes[1], nodes[2], ntri, nqua, node0, node1);
    if (nqua > 0)
      printf("qua %d %d %d %d %d\n", qua_nodes[0], qua_nodes[1], qua_nodes[2],
             qua_nodes[3], qua_nodes[4]);
  });
  RUS(REF_EMPTY, node1, "node1 not found");
  /* same direction as triangle or quad side */
  nodes[0] = node0;
  nodes[1] = node1;

  return REF_SUCCESS;
}